

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O0

void logUnsigned<unsigned_char>(void)

{
  Severity SVar1;
  cx_string<4UL> cVar2;
  SessionWriter *pSVar3;
  uint64_t _binlog_sid_v;
  uchar *c;
  uchar b;
  uchar a;
  memory_order __b;
  memory_order __b_1;
  EventSource *in_stack_fffffffffffffe20;
  char (*in_stack_fffffffffffffe28) [12];
  uchar *in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe38;
  __atomic_base<unsigned_long> eventSourceId;
  atomic<unsigned_long> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  Session *in_stack_fffffffffffffe50;
  data_ref in_stack_fffffffffffffe58;
  uchar local_12b [5];
  allocator local_126;
  undefined1 local_125;
  cx_string<4UL> local_124;
  allocator local_11f;
  allocator local_11e;
  allocator local_11d [20];
  allocator local_109;
  undefined8 local_108;
  undefined2 local_100;
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  undefined8 local_98;
  string local_90 [32];
  string local_70 [32];
  __atomic_base<unsigned_long> local_50;
  uchar *local_48;
  uchar local_3a [2];
  __atomic_base<unsigned_long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<unsigned_long> *local_28;
  Session *local_20;
  memory_order local_18;
  int local_14;
  Session *local_10;
  atomic<unsigned_long> *local_8;
  
  local_3a[1] = 0x14;
  local_3a[0] = '\x1e';
  local_48 = local_3a;
  pSVar3 = binlog::default_thread_local_writer();
  binlog::SessionWriter::session(pSVar3);
  SVar1 = binlog::Session::minSeverity((Session *)0x106b0c);
  if (SVar1 < 0x81) {
    local_28 = &logUnsigned<unsigned_char>::_binlog_sid;
    local_2c = 0;
    local_30 = std::operator&(memory_order_relaxed,__memory_order_mask);
    local_38 = logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    local_50 = logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if (logUnsigned<unsigned_char>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar3 = binlog::default_thread_local_writer();
      binlog::SessionWriter::session(pSVar3);
      local_108 = 0;
      local_100 = 0x80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8,"main",&local_109);
      local_12b[1] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d8,"logUnsigned",local_11d);
      local_12b[2] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_11e);
      local_12b[3] = 1;
      local_98 = 0x15;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,"{} {} {} {}",&local_11f);
      local_12b[4] = 1;
      local_125 = 0x28;
      cVar2 = binlog::detail::
              concatenated_tags<char_const(&)[12],unsigned_char&,unsigned_char_const&,unsigned_char_const&,unsigned_char>
                        ((char (*) [12])
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         (uchar *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe30,(uchar *)in_stack_fffffffffffffe28);
      local_124._data._0_4_ = cVar2._data._0_4_;
      local_124._data[4] = cVar2._data[4];
      in_stack_fffffffffffffe58 = mserialize::cx_string<4UL>::data(&local_124);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,*in_stack_fffffffffffffe58,&local_126);
      local_12b[4] = 0;
      local_12b[3] = 0;
      local_12b[2] = 0;
      local_12b[1] = 0;
      in_stack_fffffffffffffe50 =
           (Session *)
           binlog::Session::addEventSource
                     (in_stack_fffffffffffffe50,
                      (EventSource *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      local_50._M_i = (__int_type)in_stack_fffffffffffffe50;
      binlog::EventSource::~EventSource(in_stack_fffffffffffffe20);
      std::allocator<char>::~allocator((allocator<char> *)&local_126);
      std::allocator<char>::~allocator((allocator<char> *)&local_11f);
      std::allocator<char>::~allocator((allocator<char> *)&local_11e);
      std::allocator<char>::~allocator((allocator<char> *)local_11d);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      local_8 = &logUnsigned<unsigned_char>::_binlog_sid;
      local_10 = (Session *)local_50._M_i;
      local_14 = 5;
      in_stack_fffffffffffffe40 = &logUnsigned<unsigned_char>::_binlog_sid;
      local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
      local_20 = local_10;
      if (local_14 == 3) {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe40)->_session)->
        _M_i = (__int_type)local_10;
      }
      else if (local_14 == 5) {
        LOCK();
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe40)->_session)->
        _M_i = (__int_type)local_10;
        UNLOCK();
      }
      else {
        ((__atomic_base<unsigned_long> *)&((SessionWriter *)in_stack_fffffffffffffe40)->_session)->
        _M_i = (__int_type)local_10;
      }
    }
    pSVar3 = binlog::default_thread_local_writer();
    eventSourceId._M_i = local_50._M_i;
    binlog::clockNow();
    local_12b[0] = '(';
    binlog::detail::
    addEventIgnoreFirst<binlog::SessionWriter,char_const(&)[12],unsigned_char&,unsigned_char_const&,unsigned_char_const&,unsigned_char>
              ((SessionWriter *)in_stack_fffffffffffffe40,eventSourceId._M_i,(uint64_t)pSVar3,
               in_stack_fffffffffffffe28,local_12b,local_48,(uchar *)in_stack_fffffffffffffe50,
               (uchar *)in_stack_fffffffffffffe58);
  }
  return;
}

Assistant:

void logUnsigned()
{
  T a = 20;
  const T b = 30;
  const T& c = b;
  BINLOG_INFO("{} {} {} {}", a, b, c, T(40));
}